

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

Value * __thiscall
soul::heart::AggregateInitialiserList::getAsConstant
          (Value *__return_storage_ptr__,AggregateInitialiserList *this)

{
  Category CVar1;
  pool_ref<soul::heart::Expression> *ppVar2;
  long lVar3;
  size_t sVar4;
  Value v;
  Value result;
  Type local_100;
  SubElementPath local_e8;
  Value local_b0;
  Value local_70;
  
  local_100.category = (this->type).category;
  local_100.arrayElementCategory = (this->type).arrayElementCategory;
  local_100.isRef = (this->type).isRef;
  local_100.isConstant = (this->type).isConstant;
  local_100.primitiveType.type = (this->type).primitiveType.type;
  local_100.boundingSize = (this->type).boundingSize;
  local_100.arrayElementBoundingSize = (this->type).arrayElementBoundingSize;
  local_100.structure.object = (this->type).structure.object;
  if (local_100.structure.object != (Structure *)0x0) {
    ((local_100.structure.object)->super_RefCountedObject).refCount =
         ((local_100.structure.object)->super_RefCountedObject).refCount + 1;
  }
  soul::Value::zeroInitialiser(&local_70,&local_100);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_100.structure.object);
  sVar4 = (this->items).numActive;
  if (sVar4 != 0) {
    ppVar2 = (this->items).items;
    lVar3 = sVar4 << 3;
    sVar4 = 0;
    do {
      (*((ppVar2[sVar4].object)->super_Object)._vptr_Object[7])(&local_b0);
      if (local_b0.type.category == invalid) {
        (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
        (__return_storage_ptr__->allocatedData).allocatedSize = 0;
        (__return_storage_ptr__->type).category = invalid;
        (__return_storage_ptr__->type).arrayElementCategory = invalid;
        (__return_storage_ptr__->type).isRef = false;
        (__return_storage_ptr__->type).isConstant = false;
        (__return_storage_ptr__->type).primitiveType = invalid;
        (__return_storage_ptr__->type).boundingSize = 0;
        (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
        (__return_storage_ptr__->allocatedData).allocatedData.items =
             (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
        (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
        (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
LAB_0021e6b6:
        soul::Value::~Value(&local_b0);
        goto LAB_0021e6c0;
      }
      CVar1 = (this->type).category;
      if (CVar1 != structure) {
        if ((CVar1 != vector) && (CVar1 != array || (this->type).boundingSize == 0)) {
          soul::Value::castToTypeExpectingSuccess(__return_storage_ptr__,&local_b0,&this->type);
          goto LAB_0021e6b6;
        }
      }
      SubElementPath::SubElementPath(&local_e8,sVar4);
      soul::Value::modifySubElementInPlace(&local_70,&local_e8,&local_b0);
      local_e8.indexes.numActive = 0;
      if ((4 < local_e8.indexes.numAllocated) && (local_e8.indexes.items != (unsigned_long *)0x0)) {
        operator_delete__(local_e8.indexes.items);
      }
      soul::Value::~Value(&local_b0);
      sVar4 = sVar4 + 1;
      lVar3 = lVar3 + -8;
    } while (lVar3 != 0);
  }
  (__return_storage_ptr__->type).category = local_70.type.category;
  (__return_storage_ptr__->type).arrayElementCategory = local_70.type.arrayElementCategory;
  (__return_storage_ptr__->type).isRef = local_70.type.isRef;
  (__return_storage_ptr__->type).isConstant = local_70.type.isConstant;
  (__return_storage_ptr__->type).primitiveType = (PrimitiveType)local_70.type.primitiveType.type;
  (__return_storage_ptr__->type).boundingSize = local_70.type.boundingSize;
  (__return_storage_ptr__->type).arrayElementBoundingSize = local_70.type.arrayElementBoundingSize;
  (__return_storage_ptr__->type).structure.object = local_70.type.structure.object;
  local_70.type.structure.object = (Structure *)0x0;
  (__return_storage_ptr__->allocatedData).allocatedSize = local_70.allocatedData.allocatedSize;
  ArrayWithPreallocation<unsigned_char,_8UL>::ArrayWithPreallocation
            (&(__return_storage_ptr__->allocatedData).allocatedData,
             &local_70.allocatedData.allocatedData);
LAB_0021e6c0:
  soul::Value::~Value(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Value getAsConstant() const override
        {
            auto result = Value::zeroInitialiser (type);
            size_t index = 0;

            for (auto& i : items)
            {
                auto v = i->getAsConstant();

                if (! v.isValid())
                    return {};

                if (! (type.isStruct() || type.isFixedSizeArray() || type.isVector()))
                    return v.castToTypeExpectingSuccess (type);

                result.modifySubElementInPlace (index++, v);
            }

            return result;
        }